

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec.c
# Opt level: O1

bool_t ecCreateGroup(ec_o *ec,octet *xbase,octet *ybase,octet *order,size_t order_len,u32 cofactor,
                    void *stack)

{
  qr_o *pqVar1;
  size_t n;
  bool_t bVar2;
  size_t count;
  ulong uVar3;
  
  count = memNonZeroSize(order,order_len);
  bVar2 = 0;
  if ((count != 0) && (bVar2 = 0, cofactor != 0)) {
    uVar3 = count + 7 >> 3;
    pqVar1 = ec->f;
    if (uVar3 <= pqVar1->n + 1) {
      if (xbase == (octet *)0x0) {
        wwSetZero(ec->base,pqVar1->n);
      }
      else {
        bVar2 = (*pqVar1->from)(ec->base,xbase,pqVar1,stack);
        if (bVar2 == 0) {
          return 0;
        }
      }
      if (ybase == (octet *)0x0) {
        n = ec->f->n;
        wwSetZero(ec->base + n,n);
      }
      else {
        pqVar1 = ec->f;
        bVar2 = (*pqVar1->from)(ec->base + pqVar1->n,ybase,pqVar1,stack);
        if (bVar2 == 0) {
          return 0;
        }
      }
      u64From(ec->order,order,count);
      wwSetZero(ec->order + uVar3,(ec->f->n - uVar3) + 1);
      ec->cofactor = (ulong)cofactor;
      bVar2 = 1;
    }
  }
  return bVar2;
}

Assistant:

bool_t ecCreateGroup(ec_o* ec, const octet xbase[], const octet ybase[], 
	const octet order[], size_t order_len, u32 cofactor, void* stack)
{
	ASSERT(ecIsOperable(ec));
	ASSERT(memIsValid(order, order_len));
	ASSERT(memIsNullOrValid(xbase, ec->f->no));
	ASSERT(memIsNullOrValid(ybase, ec->f->no));
	// корректное описание?
	order_len = memNonZeroSize(order, order_len);
	if (order_len == 0 || 
		W_OF_O(order_len) > ec->f->n + 1 ||
		cofactor == 0 || 
		(u32)(word)cofactor != cofactor)
		return FALSE;
	// установить базовую точку
	if (xbase == 0)
		qrSetZero(ecX(ec->base), ec->f);
	else if (!qrFrom(ecX(ec->base), xbase, ec->f, stack))
		return FALSE;
	if (ybase == 0)
		qrSetZero(ecY(ec->base, ec->f->n), ec->f);
	else if (!qrFrom(ecY(ec->base, ec->f->n), ybase, ec->f, stack))
		return FALSE;
	// установить порядок и кофактор
	wwFrom(ec->order, order, order_len);
	wwSetZero(ec->order + W_OF_O(order_len), 
		ec->f->n + 1 - W_OF_O(order_len));
	ec->cofactor = (word)cofactor;
	// все нормально
	return TRUE;
}